

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall pbrt::SpotLight::PDF_Le(SpotLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  float fVar1;
  float fVar2;
  Float FVar3;
  float fVar4;
  Vector3<float> VVar5;
  
  fVar1 = this->cosFalloffStart;
  fVar4 = 1.0 - fVar1;
  fVar2 = this->cosFalloffEnd;
  *pdfPos = 0.0;
  fVar2 = (fVar1 - fVar2) * 0.5;
  VVar5 = Transform::ApplyInverse<float>(&(this->super_LightBase).renderFromLight,&ray->d);
  fVar1 = this->cosFalloffStart;
  if (fVar1 <= VVar5.super_Tuple3<pbrt::Vector3,_float>.z) {
    fVar1 = fVar4 * (1.0 / ((1.0 - fVar1) * 6.2831855));
    fVar4 = fVar4 + fVar2;
  }
  else {
    FVar3 = SmoothStepPDF(VVar5.super_Tuple3<pbrt::Vector3,_float>.z,this->cosFalloffEnd,fVar1);
    fVar1 = fVar2 * FVar3;
    fVar4 = (fVar2 + fVar4) * 6.2831855;
  }
  *pdfDir = fVar1 / fVar4;
  return;
}

Assistant:

void SpotLight::PDF_Le(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    Float p[2] = {1 - cosFalloffStart, (cosFalloffStart - cosFalloffEnd) / 2};
    *pdfPos = 0;
    // Find spotlight directional PDF based on $\cos \theta$
    Float cosTheta = CosTheta(renderFromLight.ApplyInverse(ray.d));
    if (cosTheta >= cosFalloffStart)
        *pdfDir = UniformConePDF(cosFalloffStart) * p[0] / (p[0] + p[1]);
    else
        *pdfDir = SmoothStepPDF(cosTheta, cosFalloffEnd, cosFalloffStart) * p[1] /
                  ((p[0] + p[1]) * (2 * Pi));
}